

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_TEXM3X2TEX(Context *ctx)

{
  uint uVar1;
  size_t buflen;
  size_t in_R8;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  
  if (ctx->texm3x2pad_src0 != -1) {
    uVar1 = (ctx->dest_arg).regnum;
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x2pad_src0,src0,in_R8);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x2pad_dst0,src1,in_R8);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[0].regnum,src2,in_R8);
    get_ARB1_destarg_varname(ctx,dst,buflen);
    output_line(ctx,"DP3 %s.y, %s, %s;",dst,src2,dst);
    output_line(ctx,"DP3 %s.x, %s, %s;",dst,src0,src1);
    output_line(ctx,"TEX %s, %s, texture[%d], 2D;",dst,dst,(ulong)uVar1);
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXM3X2TEX(Context *ctx)
{
    if (ctx->texm3x2pad_src0 == -1)
        return;

    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_src0,
                            src0, sizeof (src0));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_dst0,
                            src1, sizeof (src1));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src2, sizeof (src2));
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));

    output_line(ctx, "DP3 %s.y, %s, %s;", dst, src2, dst);
    output_line(ctx, "DP3 %s.x, %s, %s;", dst, src0, src1);
    output_line(ctx, "TEX %s, %s, texture[%d], 2D;", dst, dst, stage);
    emit_ARB1_dest_modifiers(ctx);
}